

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestSessionExecutor.cpp
# Opt level: O0

IterateResult __thiscall
tcu::TestSessionExecutor::iterateTestCase(TestSessionExecutor *this,TestCase *testCase)

{
  IterateResult IVar1;
  TestCaseExecutor *pTVar2;
  bad_alloc *anon_var_0;
  TestException *e;
  Exception *e_1;
  IterateResult iterateResult;
  TestLog *log;
  TestCase *testCase_local;
  TestSessionExecutor *this_local;
  
  TestContext::getLog(this->m_testCtx);
  TestContext::touchWatchdog(this->m_testCtx);
  pTVar2 = de::details::
           UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>::operator->
                     (&(this->m_caseExecutor).
                       super_UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>
                     );
  IVar1 = (*pTVar2->_vptr_TestCaseExecutor[4])(pTVar2,testCase);
  return IVar1;
}

Assistant:

TestCase::IterateResult TestSessionExecutor::iterateTestCase (TestCase* testCase)
{
	TestLog&				log				= m_testCtx.getLog();
	TestCase::IterateResult	iterateResult	= TestCase::STOP;

	m_testCtx.touchWatchdog();

	try
	{
		iterateResult = m_caseExecutor->iterate(testCase);
	}
	catch (const std::bad_alloc&)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_RESOURCE_ERROR, "Failed to allocate memory during test execution");
		m_testCtx.setTerminateAfter(true);
	}
	catch (const tcu::TestException& e)
	{
		log << e;
		m_testCtx.setTestResult(e.getTestResult(), e.getMessage());
		m_testCtx.setTerminateAfter(e.isFatal());
	}
	catch (const tcu::Exception& e)
	{
		log << e;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, e.getMessage());
	}

	return iterateResult;
}